

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_inout_free(ly_ctx *ctx,lys_node_inout *io,
                   _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  int local_24;
  int i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_node_inout *io_local;
  ly_ctx *ctx_local;
  
  for (local_24 = 0; local_24 < (int)(uint)io->tpdf_size; local_24 = local_24 + 1) {
    lys_tpdf_free(ctx,io->tpdf + local_24,private_destructor);
  }
  free(io->tpdf);
  for (local_24 = 0; local_24 < (int)(uint)io->must_size; local_24 = local_24 + 1) {
    lys_restr_free(ctx,io->must + local_24,private_destructor);
  }
  free(io->must);
  return;
}

Assistant:

static void
lys_inout_free(struct ly_ctx *ctx, struct lys_node_inout *io,
               void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i;

    /* handle only specific parts for LYS_INPUT and LYS_OUTPUT */
    for (i = 0; i < io->tpdf_size; i++) {
        lys_tpdf_free(ctx, &io->tpdf[i], private_destructor);
    }
    free(io->tpdf);

    for (i = 0; i < io->must_size; i++) {
        lys_restr_free(ctx, &io->must[i], private_destructor);
    }
    free(io->must);
}